

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3InitVtab(int isCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  Fts3Index *pFVar1;
  sqlite3 *db_00;
  Fts3Table *pFVar2;
  Fts3Hash *pFVar3;
  char **ppcVar4;
  int iVar5;
  void *__s;
  size_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  undefined4 extraout_var_00;
  char *pcVar9;
  sqlite3_stmt *psVar10;
  Fts3Table *pFVar11;
  size_t sVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  sqlite3_uint64 sVar23;
  char *pcVar24;
  int *piVar25;
  Vdbe *pVm;
  long lVar26;
  bool bVar27;
  int local_ec;
  Fts3Table *local_e8;
  char *local_e0;
  char local_d1;
  int n;
  undefined4 uStack_cc;
  ulong local_c8;
  char *local_c0;
  char *local_b8;
  void *local_b0;
  char *local_a8;
  sqlite3_stmt *local_a0;
  undefined8 *local_98;
  ulong local_90;
  char *local_88;
  int local_7c;
  sqlite3_tokenizer *pTokenizer;
  int local_6c;
  Fts3Hash *local_68;
  sqlite3 *local_60;
  char **local_58;
  undefined8 local_50;
  size_t local_48;
  size_t local_40;
  sqlite3_vtab **local_38;
  undefined4 extraout_var;
  
  local_ec = 0;
  local_d1 = (*argv)[3];
  pTokenizer = (sqlite3_tokenizer *)0x0;
  local_68 = (Fts3Hash *)pAux;
  local_38 = ppVTab;
  local_40 = strlen(argv[1]);
  local_58 = argv;
  local_48 = strlen(argv[2]);
  local_a0 = (sqlite3_stmt *)(long)argc;
  sVar23 = (long)local_a0 * 8 - 0x10;
  local_98 = (undefined8 *)sqlite3_malloc64(sVar23);
  if (local_98 != (undefined8 *)0x0) {
    memset(local_98,0,sVar23);
    __s = sqlite3_malloc64(sVar23);
    if (__s != (void *)0x0) {
      local_6c = isCreate;
      local_60 = db;
      memset(__s,0,sVar23);
      lVar21 = 3;
      iVar5 = 0;
      uVar16 = 0;
      local_e8 = (Fts3Table *)0x0;
      local_50 = 0;
      local_a8 = (char *)0x0;
      local_c0 = (char *)0x0;
      local_b8 = (char *)0x0;
      local_88 = (char *)0x0;
      local_90 = 0;
      local_7c = 0;
      pcVar9 = (char *)0x0;
      local_b0 = __s;
LAB_001b7bab:
      local_e0 = pcVar9;
      if ((iVar5 == 0) && (lVar21 < (long)local_a0)) {
        pcVar9 = local_58[lVar21];
        if ((pTokenizer == (sqlite3_tokenizer *)0x0) &&
           ((((sVar6 = strlen(pcVar9), 8 < sVar6 &&
              (iVar5 = sqlite3_strnicmp(pcVar9,"tokenize",8), iVar5 == 0)) && (-1 < (long)pcVar9[8])
             ) && (sqlite3Fts3IsIdChar_isFtsIdChar[pcVar9[8]] == '\0')))) {
          local_ec = sqlite3Fts3InitTokenizer(local_68,pcVar9 + 9,&pTokenizer,pzErr);
          iVar5 = local_ec;
        }
        else {
          if (local_d1 == '4') {
            for (lVar26 = 0; pcVar9[lVar26] != '\0'; lVar26 = lVar26 + 1) {
              if (pcVar9[lVar26] == '=') {
                pcVar7 = sqlite3_mprintf("%s");
                if (pcVar7 == (char *)0x0) {
                  local_ec = 7;
                  iVar5 = 7;
                  goto LAB_001b7c4d;
                }
                local_c8 = uVar16;
                sqlite3Fts3Dequote(pcVar7);
                piVar25 = &DAT_00224978;
                uVar16 = 0;
                goto LAB_001b7c88;
              }
            }
          }
          sVar6 = strlen(pcVar9);
          uVar16 = (ulong)((int)uVar16 + (int)sVar6 + 1);
          iVar5 = (int)local_e8;
          local_e8 = (Fts3Table *)(ulong)(iVar5 + 1);
          local_98[iVar5] = pcVar9;
          iVar5 = 0;
        }
        goto LAB_001b7c4d;
      }
      uVar20 = (uint)local_90;
      if ((iVar5 == 0) && (pcVar9 != (char *)0x0)) {
        sqlite3_free(local_c0);
        sqlite3_free(local_b8);
        if ((int)local_e8 == 0) {
          sqlite3_free(local_98);
          _n = (sqlite3_stmt *)0x0;
          local_e8 = (Fts3Table *)0x0;
          pcVar9 = sqlite3_mprintf("SELECT * FROM %Q.%Q",local_58[1],pcVar9);
          if (pcVar9 == (char *)0x0) {
            iVar5 = 7;
          }
          else {
            iVar14 = sqlite3_prepare(local_60,pcVar9,-1,(sqlite3_stmt **)&n,(char **)0x0);
            iVar5 = 0;
            if (iVar14 != 0) {
              pcVar7 = sqlite3_errmsg(local_60);
              sqlite3Fts3ErrMsg(pzErr,"%s",pcVar7);
              iVar5 = iVar14;
            }
          }
          sqlite3_free(pcVar9);
          psVar10 = _n;
          if (iVar5 == 0) {
            iVar5 = 0;
            local_e8 = (Fts3Table *)0x0;
            if (_n != (sqlite3_stmt *)0x0) {
              local_e8 = (Fts3Table *)(ulong)*(ushort *)(_n + 0xc0);
            }
            uVar16 = 0;
            for (; (int)local_e8 != iVar5; iVar5 = iVar5 + 1) {
              pcVar9 = sqlite3_column_name(psVar10,iVar5);
              sVar6 = strlen(pcVar9);
              uVar16 = uVar16 + sVar6 + 1;
            }
            pcVar9 = (char *)((ulong)local_e8 & 0xffffffff);
            local_98 = (undefined8 *)sqlite3_malloc64(uVar16 + (long)pcVar9 * 8);
            if (local_98 == (undefined8 *)0x0) {
              iVar5 = 7;
            }
            else {
              puVar18 = local_98 + (long)pcVar9;
              iVar5 = 0;
              local_a0 = psVar10;
              local_c8 = uVar16;
              local_c0 = pcVar9;
              for (pcVar7 = (char *)0x0; uVar16 = local_c8, local_c0 != pcVar7; pcVar7 = pcVar7 + 1)
              {
                pcVar9 = sqlite3_column_name(psVar10,(int)pcVar7);
                sVar6 = strlen(pcVar9);
                psVar10 = local_a0;
                sVar6 = (long)((sVar6 << 0x20) + 0x100000000) >> 0x20;
                memcpy(puVar18,pcVar9,sVar6);
                local_98[(long)pcVar7] = puVar18;
                puVar18 = (undefined8 *)((long)puVar18 + sVar6);
              }
            }
            sqlite3_finalize(psVar10);
            uVar20 = (uint)local_90;
          }
          else {
            local_98 = (undefined8 *)0x0;
          }
          pcVar9 = local_88;
          local_c0 = (char *)0x0;
          local_ec = iVar5;
          if ((iVar5 == 0) && (local_88 != (char *)0x0)) {
            pFVar11 = (Fts3Table *)((ulong)local_e8 & 0xffffffff);
            uVar17 = 0;
            local_c8 = uVar16;
LAB_001b8173:
            if (pFVar11 != (Fts3Table *)uVar17) {
              iVar5 = sqlite3_stricmp(pcVar9,(char *)local_98[uVar17]);
              if (iVar5 != 0) goto code_r0x001b818d;
              pFVar11 = (Fts3Table *)uVar17;
              if ((int)uVar17 < (int)local_e8) {
                pFVar11 = local_e8;
              }
              for (; ((ulong)pFVar11 & 0xffffffff) != uVar17; uVar17 = uVar17 + 1) {
                local_98[uVar17] = local_98[uVar17 + 1];
              }
              pFVar11 = (Fts3Table *)(ulong)((int)local_e8 - 1);
            }
            local_e8 = pFVar11;
            local_b8 = (char *)0x0;
            local_c0 = (char *)0x0;
            uVar16 = local_c8;
            __s = local_b0;
            goto LAB_001b81fc;
          }
        }
        local_c0 = (char *)0x0;
        local_b8 = (char *)0x0;
        iVar5 = local_ec;
      }
      pcVar9 = local_88;
      if (iVar5 == 0) {
LAB_001b81fc:
        if ((int)local_e8 == 0) {
          *local_98 = "content";
          local_e8 = (Fts3Table *)0x1;
          uVar16 = 8;
        }
        if ((pTokenizer != (sqlite3_tokenizer *)0x0) ||
           (local_ec = sqlite3Fts3InitTokenizer(local_68,"simple",&pTokenizer,pzErr), local_ec == 0)
           ) {
          uVar15 = 1;
          if ((local_a8 != (char *)0x0) && (cVar13 = *local_a8, cVar13 != '\0')) {
            uVar15 = 2;
            pcVar9 = local_a8;
            do {
              pcVar9 = pcVar9 + 1;
              if (cVar13 == ',') {
                uVar15 = uVar15 + 1;
              }
              else if (cVar13 == '\0') break;
              cVar13 = *pcVar9;
            } while( true );
          }
          local_c8 = uVar16;
          psVar10 = (sqlite3_stmt *)sqlite3_malloc64((long)(int)uVar15 * 0x28);
          if (psVar10 == (sqlite3_stmt *)0x0) {
            local_ec = 7;
            uVar15 = 0;
          }
          else {
            memset(psVar10,0,(long)(int)uVar15 * 0x28);
            local_ec = 0;
            if (local_a8 != (char *)0x0) {
              iVar5 = 1;
              pcVar9 = local_a8;
              while (iVar5 < (int)uVar15) {
                lVar21 = 0;
                iVar14 = 0;
                pcVar7 = pcVar9;
                while( true ) {
                  pcVar9 = pcVar7 + 1;
                  if (9 < (byte)(*pcVar7 - 0x30U)) break;
                  iVar14 = (uint)(byte)(*pcVar7 - 0x30U) + iVar14 * 10;
                  if (10000000 < iVar14) {
                    if (lVar21 == 0) goto LAB_001b872a;
                    goto LAB_001b8301;
                  }
                  lVar21 = lVar21 + -1;
                  pcVar7 = pcVar9;
                }
                if (lVar21 == 0) {
LAB_001b872a:
                  local_ec = 1;
                  uVar15 = 0;
                  sqlite3Fts3ErrMsg(pzErr,"error parsing prefix parameter: %s",local_a8);
                  break;
                }
                if (iVar14 == 0) {
LAB_001b8301:
                  uVar15 = uVar15 - 1;
                }
                else {
                  *(int *)(psVar10 + (long)iVar5 * 0x28) = iVar14;
                  iVar5 = iVar5 + 1;
                }
              }
            }
          }
          local_a0 = psVar10;
          if (local_ec == 0) {
            iVar5 = (int)local_e8;
            uVar17 = (ulong)(int)local_e8;
            local_68 = (Fts3Hash *)((long)(int)uVar15 * 0x28);
            uVar16 = (ulong)((int)local_48 + 1);
            local_e8 = (Fts3Table *)(long)((int)local_40 + 1);
            sVar23 = (long)&local_68[0x10].first +
                     (long)(int)local_c8 + uVar17 * 9 + (long)local_e8 + uVar16;
            local_c8 = uVar16;
            pFVar11 = (Fts3Table *)sqlite3_malloc64(sVar23);
            if (pFVar11 != (Fts3Table *)0x0) {
              uVar22 = 0;
              memset(pFVar11,0,sVar23);
              pFVar3 = local_68;
              pFVar11->nPendingData = 0;
              bVar27 = local_d1 == '4';
              pFVar11->db = local_60;
              pFVar11->nColumn = iVar5;
              pFVar11->azColumn = (char **)(pFVar11 + 1);
              pFVar11->pTokenizer = pTokenizer;
              pFVar11->nMaxPendingData = 0x100000;
              pFVar11->bHasStat = bVar27;
              pFVar11->bFts4 = bVar27;
              pFVar11->bHasDocsize = bVar27 && local_7c == 0;
              pFVar11->bDescIdx = (u8)local_50;
              pFVar11->nAutoincrmerge = 0xff;
              pFVar11->zContentTbl = local_e0;
              pFVar11->zLanguageid = local_88;
              pFVar11->aIndex = (Fts3Index *)(pFVar11[1].aStmt + (uVar17 - 0xd));
              local_e0 = (char *)uVar17;
              memcpy((Fts3Index *)(pFVar11[1].aStmt + (uVar17 - 0xd)),local_a0,(size_t)local_68);
              ppcVar4 = local_58;
              uVar16 = local_c8;
              pcVar9 = local_e0;
              pFVar11->nIndex = uVar15;
              uVar17 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar17 = uVar22;
              }
              for (; pFVar1 = pFVar11->aIndex, uVar17 * 0x28 - uVar22 != 0; uVar22 = uVar22 + 0x28)
              {
                *(undefined2 *)(&(pFVar1->hPending).keyClass + uVar22) = 0x101;
                *(undefined8 *)((long)&(pFVar1->hPending).ht + uVar22) = 0;
                puVar18 = (undefined8 *)((long)&(pFVar1->hPending).count + uVar22);
                *puVar18 = 0;
                puVar18[1] = 0;
              }
              pFVar11->abNotindexed = (u8 *)(&pFVar3->keyClass + (long)&pFVar1->nPrefix);
              pcVar24 = &pFVar3->keyClass + (long)&pFVar1->nPrefix + (long)local_e0;
              pFVar11->zName = pcVar24;
              memcpy(pcVar24,local_58[2],local_c8);
              pFVar2 = local_e8;
              pcVar24 = pcVar24 + uVar16;
              pFVar11->zDb = pcVar24;
              memcpy(pcVar24,ppcVar4[1],(size_t)local_e8);
              pcVar24 = pcVar24 + (long)pFVar2;
              pcVar7 = (char *)0x0;
              local_e0 = (char *)((ulong)pcVar9 & 0xffffffff);
              if ((int)pcVar9 < 1) {
                local_e0 = pcVar7;
              }
              for (; local_e0 != pcVar7; pcVar7 = pcVar7 + 1) {
                _n = (sqlite3_stmt *)((ulong)_n & 0xffffffff00000000);
                pcVar9 = sqlite3Fts3NextToken((char *)local_98[(long)pcVar7],&n);
                sVar6 = (size_t)n;
                if (0 < (long)sVar6) {
                  memcpy(pcVar24,pcVar9,sVar6);
                }
                pcVar24[sVar6] = '\0';
                sqlite3Fts3Dequote(pcVar24);
                pFVar11->azColumn[(long)pcVar7] = pcVar24;
                pcVar24 = pcVar24 + sVar6 + 1;
              }
              pcVar9 = (char *)0x0;
              uVar16 = 0;
              local_e8 = pFVar11;
              if (0 < (int)local_90) {
                uVar16 = local_90 & 0xffffffff;
              }
              for (; pcVar9 != local_e0; pcVar9 = pcVar9 + 1) {
                sVar6 = strlen(local_e8->azColumn[(long)pcVar9]);
                for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
                  pcVar7 = *(char **)((long)__s + uVar17 * 8);
                  if (pcVar7 != (char *)0x0) {
                    sVar12 = strlen(pcVar7);
                    if (((int)sVar6 == (int)sVar12) &&
                       (iVar5 = sqlite3_strnicmp(local_e8->azColumn[(long)pcVar9],pcVar7,(int)sVar6)
                       , iVar5 == 0)) {
                      local_e8->abNotindexed[(long)pcVar9] = '\x01';
                      sqlite3_free(pcVar7);
                      *(undefined8 *)((long)__s + uVar17 * 8) = 0;
                    }
                  }
                }
              }
              iVar5 = 0;
              for (uVar17 = 0; pcVar9 = local_c0, uVar16 != uVar17; uVar17 = uVar17 + 1) {
                if (*(long *)((long)local_b0 + uVar17 * 8) != 0) {
                  sqlite3Fts3ErrMsg(pzErr,"no such column: %s");
                  iVar5 = 1;
                }
              }
              local_ec = iVar5;
              if ((iVar5 == 0) && ((local_b8 != (char *)0x0) == (local_c0 == (char *)0x0))) {
                pcVar7 = "uncompress";
                if (local_c0 == (char *)0x0) {
                  pcVar7 = "compress";
                }
                local_ec = 1;
                sqlite3Fts3ErrMsg(pzErr,"missing %s parameter in fts4 constructor",pcVar7);
              }
              pFVar11 = local_e8;
              _n = (sqlite3_stmt *)0x0;
              if (local_e8->zContentTbl == (char *)0x0) {
                if (local_b8 == (char *)0x0) {
                  pcVar9 = "";
                  local_e0 = (char *)0x0;
                }
                else {
                  pcVar9 = fts3QuoteId(local_b8);
                  local_e0 = pcVar9;
                }
                __s = local_b0;
                fts3Appendf(&local_ec,(char **)&n,"docid");
                for (uVar16 = 0; (long)uVar16 < (long)pFVar11->nColumn; uVar16 = uVar16 + 1) {
                  fts3Appendf(&local_ec,(char **)&n,",%s(x.\'c%d%q\')",pcVar9,uVar16 & 0xffffffff,
                              pFVar11->azColumn[uVar16]);
                }
                if (pFVar11->zLanguageid != (char *)0x0) {
                  fts3Appendf(&local_ec,(char **)&n,", x.%Q","langid");
                }
                sqlite3_free(local_e0);
                pcVar9 = local_c0;
              }
              else {
                fts3Appendf(&local_ec,(char **)&n,"rowid");
                for (lVar21 = 0; __s = local_b0, lVar21 < pFVar11->nColumn; lVar21 = lVar21 + 1) {
                  fts3Appendf(&local_ec,(char **)&n,", x.\'%q\'",pFVar11->azColumn[lVar21]);
                }
                if (pFVar11->zLanguageid != (char *)0x0) {
                  fts3Appendf(&local_ec,(char **)&n,", x.%Q");
                }
              }
              pcVar24 = "";
              pcVar7 = pFVar11->zContentTbl;
              pcVar19 = "";
              if (pcVar7 == (char *)0x0) {
                pcVar7 = pFVar11->zName;
                pcVar19 = "_content";
              }
              fts3Appendf(&local_ec,(char **)&n," FROM \'%q\'.\'%q%s\' AS x",pFVar11->zDb,pcVar7,
                          pcVar19);
              pFVar11->zReadExprlist = (char *)_n;
              _n = (sqlite3_stmt *)0x0;
              if (pcVar9 == (char *)0x0) {
                local_e0 = (char *)0x0;
              }
              else {
                pcVar24 = fts3QuoteId(pcVar9);
                local_e0 = pcVar24;
              }
              fts3Appendf(&local_ec,(char **)&n,"?");
              for (iVar5 = 0; pFVar11 = local_e8, iVar5 < local_e8->nColumn; iVar5 = iVar5 + 1) {
                fts3Appendf(&local_ec,(char **)&n,",%s(?)",pcVar24);
              }
              if (local_e8->zLanguageid != (char *)0x0) {
                fts3Appendf(&local_ec,(char **)&n,", ?");
              }
              sqlite3_free(local_e0);
              pcVar7 = local_a8;
              pFVar11->zWriteExprlist = (char *)_n;
              uVar20 = (uint)local_90;
              if (local_ec == 0) {
                if (local_6c == 0) {
                  bVar27 = true;
                }
                else {
                  _n = (sqlite3_stmt *)((ulong)_n & 0xffffffff00000000);
                  db_00 = pFVar11->db;
                  if (pFVar11->zContentTbl == (char *)0x0) {
                    local_e0 = pFVar11->zLanguageid;
                    pcVar9 = sqlite3_mprintf("docid INTEGER PRIMARY KEY");
                    uVar16 = 0;
                    while (pcVar9 != (char *)0x0) {
                      if ((long)local_e8->nColumn <= (long)uVar16) {
                        if ((local_e0 == (char *)0x0) ||
                           (pcVar9 = sqlite3_mprintf("%z, langid",pcVar9), pcVar9 != (char *)0x0))
                        goto LAB_001b89f9;
                        break;
                      }
                      pcVar9 = sqlite3_mprintf("%z, \'c%d%q\'",pcVar9,uVar16 & 0xffffffff,
                                               local_e8->azColumn[uVar16]);
                      uVar16 = uVar16 + 1;
                    }
                    _n = (sqlite3_stmt *)CONCAT44(uStack_cc,7);
                    pcVar9 = (char *)0x0;
LAB_001b89f9:
                    pFVar11 = local_e8;
                    fts3DbExec(&n,db_00,"CREATE TABLE %Q.\'%q_content\'(%s)",local_e8->zDb,
                               local_e8->zName,pcVar9);
                    sqlite3_free(pcVar9);
                    uVar20 = (uint)local_90;
                  }
                  fts3DbExec(&n,db_00,
                             "CREATE TABLE %Q.\'%q_segments\'(blockid INTEGER PRIMARY KEY, block BLOB);"
                             ,pFVar11->zDb,pFVar11->zName);
                  fts3DbExec(&n,db_00,
                             "CREATE TABLE %Q.\'%q_segdir\'(level INTEGER,idx INTEGER,start_block INTEGER,leaves_end_block INTEGER,end_block INTEGER,root BLOB,PRIMARY KEY(level, idx));"
                             ,pFVar11->zDb);
                  if (pFVar11->bHasDocsize != '\0') {
                    fts3DbExec(&n,db_00,
                               "CREATE TABLE %Q.\'%q_docsize\'(docid INTEGER PRIMARY KEY, size BLOB);"
                               ,pFVar11->zDb);
                  }
                  if (pFVar11->bHasStat != '\0') {
                    sqlite3Fts3CreateStatTable(&n,pFVar11);
                  }
                  local_ec = n;
                  bVar27 = n == 0;
                }
                if (local_d1 != '4' && local_6c == 0) {
                  pFVar11->bHasStat = '\x02';
                }
                if (bVar27) {
                  pcVar9 = sqlite3_mprintf("PRAGMA %Q.page_size",pFVar11->zDb);
                  if (pcVar9 == (char *)0x0) {
                    iVar5 = 7;
                  }
                  else {
                    iVar5 = 0;
                    iVar14 = sqlite3_prepare(pFVar11->db,pcVar9,-1,(sqlite3_stmt **)&n,(char **)0x0)
                    ;
                    psVar10 = _n;
                    pFVar11 = local_e8;
                    if (iVar14 == 0x17) {
                      local_e8->nPgsz = 0x400;
                    }
                    else {
                      iVar5 = iVar14;
                      if (iVar14 == 0) {
                        sqlite3_step(_n);
                        iVar5 = sqlite3_column_int(psVar10,0);
                        pFVar11->nPgsz = iVar5;
                        iVar5 = sqlite3_finalize(psVar10);
                      }
                    }
                  }
                  sqlite3_free(pcVar9);
                  pFVar11->nNodeSize = pFVar11->nPgsz + -0x23;
                  local_ec = iVar5;
                  if (iVar5 == 0) {
                    pcVar9 = "__langid";
                    if (pFVar11->zLanguageid != (char *)0x0) {
                      pcVar9 = pFVar11->zLanguageid;
                    }
                    sqlite3_vtab_config(pFVar11->db,1);
                    pcVar24 = sqlite3_mprintf("%Q, ",*pFVar11->azColumn);
                    for (lVar21 = 1; (pcVar24 != (char *)0x0 && (lVar21 < local_e8->nColumn));
                        lVar21 = lVar21 + 1) {
                      pcVar24 = sqlite3_mprintf("%z%Q, ",pcVar24,local_e8->azColumn[lVar21]);
                    }
                    pcVar9 = sqlite3_mprintf("CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)"
                                             ,pcVar24,local_e8->zName,pcVar9);
                    __s = local_b0;
                    iVar5 = 7;
                    if ((pcVar24 != (char *)0x0) && (pcVar9 != (char *)0x0)) {
                      iVar5 = sqlite3_declare_vtab(local_e8->db,pcVar9);
                    }
                    sqlite3_free(pcVar9);
                    sqlite3_free(pcVar24);
                    uVar20 = (uint)local_90;
                    local_ec = iVar5;
                  }
                }
                else {
                  pFVar11->nNodeSize = pFVar11->nPgsz + -0x23;
                }
              }
              local_e0 = (char *)0x0;
              pcVar9 = (char *)0x0;
              psVar10 = local_a0;
              pcVar24 = local_b8;
              pcVar19 = local_c0;
              goto LAB_001b8b8d;
            }
            local_ec = 7;
          }
          local_e8 = (Fts3Table *)0x0;
          psVar10 = local_a0;
          pcVar24 = local_b8;
          pcVar7 = local_a8;
          pcVar9 = local_88;
          pcVar19 = local_c0;
          goto LAB_001b8b8d;
        }
      }
      local_e8 = (Fts3Table *)0x0;
      psVar10 = (sqlite3_stmt *)0x0;
      pcVar24 = local_b8;
      pcVar7 = local_a8;
      pcVar19 = local_c0;
      goto LAB_001b8b8d;
    }
  }
  local_ec = 7;
  __s = (void *)0x0;
  psVar10 = (sqlite3_stmt *)0x0;
  pcVar7 = (char *)0x0;
  pcVar19 = (char *)0x0;
  pcVar24 = (char *)0x0;
  local_e0 = (char *)0x0;
  pcVar9 = (char *)0x0;
  uVar20 = 0;
  local_e8 = (Fts3Table *)0x0;
LAB_001b8b8d:
  sqlite3_free(pcVar7);
  sqlite3_free(psVar10);
  sqlite3_free(pcVar19);
  sqlite3_free(pcVar24);
  sqlite3_free(local_e0);
  sqlite3_free(pcVar9);
  pFVar11 = local_e8;
  uVar17 = 0;
  uVar16 = (ulong)uVar20;
  if ((int)uVar20 < 1) {
    uVar16 = uVar17;
  }
  for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    sqlite3_free(*(void **)((long)__s + uVar17 * 8));
  }
  sqlite3_free(local_98);
  sqlite3_free(__s);
  iVar5 = local_ec;
  if (local_ec == 0) {
    *local_38 = &pFVar11->base;
  }
  else if (pFVar11 == (Fts3Table *)0x0) {
    if (pTokenizer != (sqlite3_tokenizer *)0x0) {
      (*pTokenizer->pModule->xDestroy)(pTokenizer);
    }
  }
  else {
    fts3DisconnectMethod(&pFVar11->base);
  }
  return iVar5;
LAB_001b7c88:
  pcVar24 = pcVar7;
  if (uVar16 == 8) goto switchD_001b7d27_default;
  if ((*piVar25 == (int)lVar26) &&
     (iVar5 = sqlite3_strnicmp(pcVar9,*(char **)(piVar25 + -2),(int)lVar26), iVar5 == 0)) {
    switch(uVar16 & 0xffffffff) {
    case 0:
      sVar6 = strlen(pcVar7);
      __s = local_b0;
      pcVar9 = local_e0;
      if ((sVar6 != 4) || (iVar5 = sqlite3_strnicmp(pcVar7,"fts3",4), iVar5 != 0)) {
        sqlite3Fts3ErrMsg(pzErr,"unrecognized matchinfo: %s",pcVar7);
        local_ec = 1;
      }
      local_7c = 1;
      uVar16 = local_c8;
      goto LAB_001b7db7;
    case 1:
      sqlite3_free(local_a8);
      pcVar24 = (char *)0x0;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      __s = local_b0;
      local_a8 = pcVar7;
      goto LAB_001b7db7;
    case 2:
      sqlite3_free(local_c0);
      pcVar24 = (char *)0x0;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      __s = local_b0;
      local_c0 = pcVar7;
      goto LAB_001b7db7;
    case 3:
      sqlite3_free(local_b8);
      pcVar24 = (char *)0x0;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      __s = local_b0;
      local_b8 = pcVar7;
      goto LAB_001b7db7;
    case 4:
      sVar6 = strlen(pcVar7);
      __s = local_b0;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      if (sVar6 == 4) {
        iVar5 = sqlite3_strnicmp(pcVar7,"desc",4);
        uVar8 = CONCAT44(extraout_var_00,iVar5);
        uVar16 = local_c8;
        if (iVar5 != 0) goto LAB_001b7e03;
      }
      else {
        if (sVar6 == 3) {
          iVar5 = sqlite3_strnicmp(pcVar7,"asc",3);
          uVar8 = CONCAT44(extraout_var,iVar5);
          if (iVar5 == 0) goto LAB_001b7e24;
        }
LAB_001b7e03:
        sqlite3Fts3ErrMsg(pzErr,"unrecognized order: %s",pcVar7);
        local_ec = 1;
        uVar8 = extraout_RAX;
      }
LAB_001b7e24:
      uVar17 = CONCAT71((int7)((ulong)uVar8 >> 8),*pcVar7) & 0xffffffffffffffdf;
      local_50 = CONCAT71((int7)(uVar17 >> 8),(char)uVar17 == 'D');
      goto LAB_001b7db7;
    case 5:
      sqlite3_free(local_e0);
      uVar16 = local_c8;
      pcVar9 = pcVar7;
      pcVar24 = (char *)0x0;
      __s = local_b0;
      goto LAB_001b7db7;
    case 6:
      sqlite3_free(local_88);
      pcVar24 = (char *)0x0;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      __s = local_b0;
      local_88 = pcVar7;
      goto LAB_001b7db7;
    case 7:
      iVar5 = (int)local_90;
      local_90 = (ulong)(iVar5 + 1);
      *(char **)((long)local_b0 + (long)iVar5 * 8) = pcVar7;
      uVar16 = local_c8;
      pcVar9 = local_e0;
      pcVar24 = (char *)0x0;
      __s = local_b0;
      goto LAB_001b7db7;
    }
    goto switchD_001b7d27_default;
  }
  uVar16 = uVar16 + 1;
  piVar25 = piVar25 + 4;
  goto LAB_001b7c88;
switchD_001b7d27_default:
  sqlite3Fts3ErrMsg(pzErr,"unrecognized parameter: %s",pcVar9);
  local_ec = 1;
  uVar16 = local_c8;
  pcVar9 = local_e0;
  __s = local_b0;
LAB_001b7db7:
  sqlite3_free(pcVar24);
  local_e0 = pcVar9;
  iVar5 = local_ec;
LAB_001b7c4d:
  lVar21 = lVar21 + 1;
  pcVar9 = local_e0;
  goto LAB_001b7bab;
code_r0x001b818d:
  uVar17 = uVar17 + 1;
  goto LAB_001b8173;
}

Assistant:

static int fts3InitVtab(
  int isCreate,                   /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts3Hash *pHash = (Fts3Hash *)pAux;
  Fts3Table *p = 0;               /* Pointer to allocated vtab */
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3_int64 nByte;            /* Size of allocation used for *p */
  int iCol;                       /* Column index */
  int nString = 0;                /* Bytes required to hold all column names */
  int nCol = 0;                   /* Number of columns in the FTS table */
  char *zCsr;                     /* Space for holding column names */
  int nDb;                        /* Bytes required to hold database name */
  int nName;                      /* Bytes required to hold table name */
  int isFts4 = (argv[0][3]=='4'); /* True for FTS4, false for FTS3 */
  const char **aCol;              /* Array of column names */
  sqlite3_tokenizer *pTokenizer = 0;        /* Tokenizer for this table */

  int nIndex = 0;                 /* Size of aIndex[] array */
  struct Fts3Index *aIndex = 0;   /* Array of indexes for this table */

  /* The results of parsing supported FTS4 key=value options: */
  int bNoDocsize = 0;             /* True to omit %_docsize table */
  int bDescIdx = 0;               /* True to store descending indexes */
  char *zPrefix = 0;              /* Prefix parameter value (or NULL) */
  char *zCompress = 0;            /* compress=? parameter (or NULL) */
  char *zUncompress = 0;          /* uncompress=? parameter (or NULL) */
  char *zContent = 0;             /* content=? parameter (or NULL) */
  char *zLanguageid = 0;          /* languageid=? parameter (or NULL) */
  char **azNotindexed = 0;        /* The set of notindexed= columns */
  int nNotindexed = 0;            /* Size of azNotindexed[] array */

  assert( strlen(argv[0])==4 );
  assert( (sqlite3_strnicmp(argv[0], "fts4", 4)==0 && isFts4)
       || (sqlite3_strnicmp(argv[0], "fts3", 4)==0 && !isFts4)
  );

  nDb = (int)strlen(argv[1]) + 1;
  nName = (int)strlen(argv[2]) + 1;

  nByte = sizeof(const char *) * (argc-2);
  aCol = (const char **)sqlite3_malloc64(nByte);
  if( aCol ){
    memset((void*)aCol, 0, nByte);
    azNotindexed = (char **)sqlite3_malloc64(nByte);
  }
  if( azNotindexed ){
    memset(azNotindexed, 0, nByte);
  }
  if( !aCol || !azNotindexed ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }

  /* Loop through all of the arguments passed by the user to the FTS3/4
  ** module (i.e. all the column names and special arguments). This loop
  ** does the following:
  **
  **   + Figures out the number of columns the FTSX table will have, and
  **     the number of bytes of space that must be allocated to store copies
  **     of the column names.
  **
  **   + If there is a tokenizer specification included in the arguments,
  **     initializes the tokenizer pTokenizer.
  */
  for(i=3; rc==SQLITE_OK && i<argc; i++){
    char const *z = argv[i];
    int nKey;
    char *zVal;

    /* Check if this is a tokenizer specification */
    if( !pTokenizer 
     && strlen(z)>8
     && 0==sqlite3_strnicmp(z, "tokenize", 8) 
     && 0==sqlite3Fts3IsIdChar(z[8])
    ){
      rc = sqlite3Fts3InitTokenizer(pHash, &z[9], &pTokenizer, pzErr);
    }

    /* Check if it is an FTS4 special argument. */
    else if( isFts4 && fts3IsSpecialColumn(z, &nKey, &zVal) ){
      struct Fts4Option {
        const char *zOpt;
        int nOpt;
      } aFts4Opt[] = {
        { "matchinfo",   9 },     /* 0 -> MATCHINFO */
        { "prefix",      6 },     /* 1 -> PREFIX */
        { "compress",    8 },     /* 2 -> COMPRESS */
        { "uncompress", 10 },     /* 3 -> UNCOMPRESS */
        { "order",       5 },     /* 4 -> ORDER */
        { "content",     7 },     /* 5 -> CONTENT */
        { "languageid", 10 },     /* 6 -> LANGUAGEID */
        { "notindexed", 10 }      /* 7 -> NOTINDEXED */
      };

      int iOpt;
      if( !zVal ){
        rc = SQLITE_NOMEM;
      }else{
        for(iOpt=0; iOpt<SizeofArray(aFts4Opt); iOpt++){
          struct Fts4Option *pOp = &aFts4Opt[iOpt];
          if( nKey==pOp->nOpt && !sqlite3_strnicmp(z, pOp->zOpt, pOp->nOpt) ){
            break;
          }
        }
        switch( iOpt ){
          case 0:               /* MATCHINFO */
            if( strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "fts3", 4) ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized matchinfo: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bNoDocsize = 1;
            break;

          case 1:               /* PREFIX */
            sqlite3_free(zPrefix);
            zPrefix = zVal;
            zVal = 0;
            break;

          case 2:               /* COMPRESS */
            sqlite3_free(zCompress);
            zCompress = zVal;
            zVal = 0;
            break;

          case 3:               /* UNCOMPRESS */
            sqlite3_free(zUncompress);
            zUncompress = zVal;
            zVal = 0;
            break;

          case 4:               /* ORDER */
            if( (strlen(zVal)!=3 || sqlite3_strnicmp(zVal, "asc", 3)) 
             && (strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "desc", 4)) 
            ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized order: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bDescIdx = (zVal[0]=='d' || zVal[0]=='D');
            break;

          case 5:              /* CONTENT */
            sqlite3_free(zContent);
            zContent = zVal;
            zVal = 0;
            break;

          case 6:              /* LANGUAGEID */
            assert( iOpt==6 );
            sqlite3_free(zLanguageid);
            zLanguageid = zVal;
            zVal = 0;
            break;

          case 7:              /* NOTINDEXED */
            azNotindexed[nNotindexed++] = zVal;
            zVal = 0;
            break;

          default:
            assert( iOpt==SizeofArray(aFts4Opt) );
            sqlite3Fts3ErrMsg(pzErr, "unrecognized parameter: %s", z);
            rc = SQLITE_ERROR;
            break;
        }
        sqlite3_free(zVal);
      }
    }

    /* Otherwise, the argument is a column name. */
    else {
      nString += (int)(strlen(z) + 1);
      aCol[nCol++] = z;
    }
  }

  /* If a content=xxx option was specified, the following:
  **
  **   1. Ignore any compress= and uncompress= options.
  **
  **   2. If no column names were specified as part of the CREATE VIRTUAL
  **      TABLE statement, use all columns from the content table.
  */
  if( rc==SQLITE_OK && zContent ){
    sqlite3_free(zCompress); 
    sqlite3_free(zUncompress); 
    zCompress = 0;
    zUncompress = 0;
    if( nCol==0 ){
      sqlite3_free((void*)aCol); 
      aCol = 0;
      rc = fts3ContentColumns(db, argv[1], zContent,&aCol,&nCol,&nString,pzErr);

      /* If a languageid= option was specified, remove the language id
      ** column from the aCol[] array. */ 
      if( rc==SQLITE_OK && zLanguageid ){
        int j;
        for(j=0; j<nCol; j++){
          if( sqlite3_stricmp(zLanguageid, aCol[j])==0 ){
            int k;
            for(k=j; k<nCol; k++) aCol[k] = aCol[k+1];
            nCol--;
            break;
          }
        }
      }
    }
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  if( nCol==0 ){
    assert( nString==0 );
    aCol[0] = "content";
    nString = 8;
    nCol = 1;
  }

  if( pTokenizer==0 ){
    rc = sqlite3Fts3InitTokenizer(pHash, "simple", &pTokenizer, pzErr);
    if( rc!=SQLITE_OK ) goto fts3_init_out;
  }
  assert( pTokenizer );

  rc = fts3PrefixParameter(zPrefix, &nIndex, &aIndex);
  if( rc==SQLITE_ERROR ){
    assert( zPrefix );
    sqlite3Fts3ErrMsg(pzErr, "error parsing prefix parameter: %s", zPrefix);
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* Allocate and populate the Fts3Table structure. */
  nByte = sizeof(Fts3Table) +                  /* Fts3Table */
          nCol * sizeof(char *) +              /* azColumn */
          nIndex * sizeof(struct Fts3Index) +  /* aIndex */
          nCol * sizeof(u8) +                  /* abNotindexed */
          nName +                              /* zName */
          nDb +                                /* zDb */
          nString;                             /* Space for azColumn strings */
  p = (Fts3Table*)sqlite3_malloc64(nByte);
  if( p==0 ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }
  memset(p, 0, nByte);
  p->db = db;
  p->nColumn = nCol;
  p->nPendingData = 0;
  p->azColumn = (char **)&p[1];
  p->pTokenizer = pTokenizer;
  p->nMaxPendingData = FTS3_MAX_PENDING_DATA;
  p->bHasDocsize = (isFts4 && bNoDocsize==0);
  p->bHasStat = (u8)isFts4;
  p->bFts4 = (u8)isFts4;
  p->bDescIdx = (u8)bDescIdx;
  p->nAutoincrmerge = 0xff;   /* 0xff means setting unknown */
  p->zContentTbl = zContent;
  p->zLanguageid = zLanguageid;
  zContent = 0;
  zLanguageid = 0;
  TESTONLY( p->inTransaction = -1 );
  TESTONLY( p->mxSavepoint = -1 );

  p->aIndex = (struct Fts3Index *)&p->azColumn[nCol];
  memcpy(p->aIndex, aIndex, sizeof(struct Fts3Index) * nIndex);
  p->nIndex = nIndex;
  for(i=0; i<nIndex; i++){
    fts3HashInit(&p->aIndex[i].hPending, FTS3_HASH_STRING, 1);
  }
  p->abNotindexed = (u8 *)&p->aIndex[nIndex];

  /* Fill in the zName and zDb fields of the vtab structure. */
  zCsr = (char *)&p->abNotindexed[nCol];
  p->zName = zCsr;
  memcpy(zCsr, argv[2], nName);
  zCsr += nName;
  p->zDb = zCsr;
  memcpy(zCsr, argv[1], nDb);
  zCsr += nDb;

  /* Fill in the azColumn array */
  for(iCol=0; iCol<nCol; iCol++){
    char *z; 
    int n = 0;
    z = (char *)sqlite3Fts3NextToken(aCol[iCol], &n);
    if( n>0 ){
      memcpy(zCsr, z, n);
    }
    zCsr[n] = '\0';
    sqlite3Fts3Dequote(zCsr);
    p->azColumn[iCol] = zCsr;
    zCsr += n+1;
    assert( zCsr <= &((char *)p)[nByte] );
  }

  /* Fill in the abNotindexed array */
  for(iCol=0; iCol<nCol; iCol++){
    int n = (int)strlen(p->azColumn[iCol]);
    for(i=0; i<nNotindexed; i++){
      char *zNot = azNotindexed[i];
      if( zNot && n==(int)strlen(zNot)
       && 0==sqlite3_strnicmp(p->azColumn[iCol], zNot, n) 
      ){
        p->abNotindexed[iCol] = 1;
        sqlite3_free(zNot);
        azNotindexed[i] = 0;
      }
    }
  }
  for(i=0; i<nNotindexed; i++){
    if( azNotindexed[i] ){
      sqlite3Fts3ErrMsg(pzErr, "no such column: %s", azNotindexed[i]);
      rc = SQLITE_ERROR;
    }
  }

  if( rc==SQLITE_OK && (zCompress==0)!=(zUncompress==0) ){
    char const *zMiss = (zCompress==0 ? "compress" : "uncompress");
    rc = SQLITE_ERROR;
    sqlite3Fts3ErrMsg(pzErr, "missing %s parameter in fts4 constructor", zMiss);
  }
  p->zReadExprlist = fts3ReadExprList(p, zUncompress, &rc);
  p->zWriteExprlist = fts3WriteExprList(p, zCompress, &rc);
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* If this is an xCreate call, create the underlying tables in the 
  ** database. TODO: For xConnect(), it could verify that said tables exist.
  */
  if( isCreate ){
    rc = fts3CreateTables(p);
  }

  /* Check to see if a legacy fts3 table has been "upgraded" by the
  ** addition of a %_stat table so that it can use incremental merge.
  */
  if( !isFts4 && !isCreate ){
    p->bHasStat = 2;
  }

  /* Figure out the page-size for the database. This is required in order to
  ** estimate the cost of loading large doclists from the database.  */
  fts3DatabasePageSize(&rc, p);
  p->nNodeSize = p->nPgsz-35;

  /* Declare the table schema to SQLite. */
  fts3DeclareVtab(&rc, p);

fts3_init_out:
  sqlite3_free(zPrefix);
  sqlite3_free(aIndex);
  sqlite3_free(zCompress);
  sqlite3_free(zUncompress);
  sqlite3_free(zContent);
  sqlite3_free(zLanguageid);
  for(i=0; i<nNotindexed; i++) sqlite3_free(azNotindexed[i]);
  sqlite3_free((void *)aCol);
  sqlite3_free((void *)azNotindexed);
  if( rc!=SQLITE_OK ){
    if( p ){
      fts3DisconnectMethod((sqlite3_vtab *)p);
    }else if( pTokenizer ){
      pTokenizer->pModule->xDestroy(pTokenizer);
    }
  }else{
    assert( p->pSegments==0 );
    *ppVTab = &p->base;
  }
  return rc;
}